

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O1

clip_image_size
llava_uhd::get_refine_size
          (clip_image_size *original_size,clip_image_size *grid,int scale_resolution,int patch_size,
          bool allow_upscale)

{
  int iVar1;
  int iVar2;
  clip_image_size cVar3;
  clip_image_size cVar4;
  float fVar5;
  clip_image_size grid_size;
  clip_image_size local_38;
  
  iVar1 = grid->width;
  iVar2 = grid->height;
  fVar5 = roundf((float)original_size->width / (float)iVar1);
  local_38.width = (int)(fVar5 * (float)iVar1);
  if (local_38.width <= iVar1) {
    local_38.width = iVar1;
  }
  fVar5 = roundf((float)original_size->height / (float)iVar2);
  local_38.height = (int)(fVar5 * (float)iVar2);
  if (local_38.height <= iVar2) {
    local_38.height = iVar2;
  }
  local_38.width = local_38.width / iVar1;
  local_38.height = local_38.height / iVar2;
  cVar3 = get_best_resize(&local_38,scale_resolution,patch_size,allow_upscale);
  cVar4.height = cVar3.height * iVar2;
  cVar4.width = cVar3.width * iVar1;
  return cVar4;
}

Assistant:

static clip_image_size get_refine_size(const clip_image_size & original_size, const clip_image_size & grid, int scale_resolution, int patch_size, bool allow_upscale = false) {
        int width  = original_size.width;
        int height = original_size.height;
        int grid_x = grid.width;
        int grid_y = grid.height;

        int refine_width  = ensure_divide(width, grid_x);
        int refine_height = ensure_divide(height, grid_y);

        clip_image_size grid_size;
        grid_size.width  = refine_width  / grid_x;
        grid_size.height = refine_height / grid_y;

        auto best_grid_size  = get_best_resize(grid_size, scale_resolution, patch_size, allow_upscale);
        int best_grid_width  = best_grid_size.width;
        int best_grid_height = best_grid_size.height;

        clip_image_size refine_size;
        refine_size.width  = best_grid_width  * grid_x;
        refine_size.height = best_grid_height * grid_y;
        return refine_size;
    }